

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aac.cpp
# Opt level: O3

void __thiscall AACCodec::readConfig(AACCodec *this,uint8_t *buff,int size)

{
  byte bVar1;
  uint uVar2;
  BitStreamReader reader;
  BitStreamReader local_38;
  
  local_38.super_BitStream.m_totalBits = 0;
  local_38.super_BitStream.m_buffer = (uint *)0x0;
  local_38.super_BitStream.m_initBuffer = (uint *)0x0;
  local_38.m_curVal = 0;
  local_38.m_bitLeft = 0;
  BitStream::setBuffer(&local_38.super_BitStream,buff,buff + size);
  local_38._24_8_ = local_38._24_8_ & 0xffffffff;
  local_38.m_curVal = BitStreamReader::getCurVal(&local_38,local_38.super_BitStream.m_buffer);
  local_38.m_bitLeft = 0x20;
  uVar2 = BitStreamReader::getBits(&local_38,5);
  bVar1 = (byte)uVar2;
  if (bVar1 == 0x1f) {
    uVar2 = BitStreamReader::getBits(&local_38,6);
    bVar1 = (char)uVar2 + 0x20;
  }
  this->m_profile = (bVar1 & 3) - 1;
  uVar2 = BitStreamReader::getBits(&local_38,4);
  this->m_sample_rates_index = (uint8_t)uVar2;
  if ((uint8_t)uVar2 == '\x0f') {
    uVar2 = BitStreamReader::getBits(&local_38,0x18);
  }
  else {
    uVar2 = aac_sample_rates[uVar2 & 0xff];
  }
  this->m_sample_rate = uVar2;
  uVar2 = BitStreamReader::getBits(&local_38,4);
  this->m_channels_index = (uint8_t)uVar2;
  this->m_channels = ""[uVar2 & 0xff];
  return;
}

Assistant:

void AACCodec::readConfig(uint8_t* buff, const int size)
{
    BitStreamReader reader{};
    reader.setBuffer(buff, buff + size);
    auto object_type = reader.getBits<uint8_t>(5);
    if (object_type == 31)
        object_type = 32 + reader.getBits<uint8_t>(6);
    m_profile = (object_type & 0x3) - 1;
    m_sample_rates_index = reader.getBits<uint8_t>(4);
    m_sample_rate = m_sample_rates_index == 0x0f ? reader.getBits<int>(24) : aac_sample_rates[m_sample_rates_index];
    m_channels_index = reader.getBits<uint8_t>(4);
    m_channels = aac_channels[m_channels_index];
    // return specific_config_bitindex;
}